

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool PairSearchHelperBoolTolerance
               (ON_RTreeBranch *a_branchA,ON_RTreeNode *a_nodeB,
               ON_RTreePairSearchCallbackResultBoolTolerance *a_result)

{
  bool bVar1;
  ON_RTreeBranch *pOVar2;
  ON_RTreeBranch *branchBmax;
  ON_RTreeBranch *branchB;
  ON_RTreePairSearchCallbackResultBoolTolerance *a_result_local;
  ON_RTreeNode *a_nodeB_local;
  ON_RTreeBranch *a_branchA_local;
  
  branchBmax = a_nodeB->m_branch;
  pOVar2 = branchBmax + a_nodeB->m_count;
  do {
    if (pOVar2 <= branchBmax) {
      return true;
    }
    bVar1 = PairSearchOverlapHelper(&a_branchA->m_rect,&branchBmax->m_rect,a_result->m_tolerance);
    if (bVar1) {
      if (a_nodeB->m_level < 1) {
        bVar1 = (*a_result->m_resultCallbackBoolTolerance)
                          (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                           (ON__INT_PTR)(branchBmax->field_1).m_child,&a_result->m_tolerance);
        if (!bVar1) {
          return false;
        }
      }
      else {
        bVar1 = PairSearchHelperBoolTolerance(a_branchA,(branchBmax->field_1).m_child,a_result);
        if (!bVar1) {
          return false;
        }
      }
    }
    branchBmax = branchBmax + 1;
  } while( true );
}

Assistant:

static bool PairSearchHelperBoolTolerance(const ON_RTreeBranch* a_branchA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResultBoolTolerance* a_result)
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchB, *branchBmax;

  branchB = a_nodeB->m_branch;
  branchBmax = branchB + a_nodeB->m_count;
  while (branchB < branchBmax)
  {
    if (PairSearchOverlapHelper(&a_branchA->m_rect, &branchB->m_rect, a_result->m_tolerance))
    {
      if (a_nodeB->m_level > 0)
      {
        if (!PairSearchHelperBoolTolerance(a_branchA, branchB->m_child, a_result))
          return false;
      }
      else
      {
        if (!a_result->m_resultCallbackBoolTolerance(a_result->m_context, a_branchA->m_id, branchB->m_id, &a_result->m_tolerance))
          return false;
      }
    }
    branchB++;
  }
  return true;
}